

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O2

void __thiscall
ASCFile::parse_pin(ASCFile *this,char **p,char **s,char **arena,char **arena_end,
                  line_iterator_t *line_it)

{
  byte bVar1;
  BRDPartMountingSide BVar2;
  double dVar3;
  double dVar4;
  char **ppcVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  allocator<char> local_1b9;
  char **local_1b8;
  BRDPart part;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->m_firstpin == true) {
    line_it->_M_current = line_it->_M_current + 7;
    this->m_firstpin = false;
  }
  else {
    pcVar8 = *p;
    local_1b8 = arena_end;
    iVar6 = strncmp(pcVar8,"Part",4);
    if (iVar6 == 0) {
      pbVar9 = (byte *)(pcVar8 + 4);
      *p = (char *)pbVar9;
      part.name = (char *)0x0;
      part.mfgcode._M_dataplus._M_p = (pointer)&part.mfgcode.field_2;
      part.mfgcode._M_string_length = 0;
      part.mfgcode.field_2._M_allocated_capacity =
           part.mfgcode.field_2._M_allocated_capacity & 0xffffffffffffff00;
      part.mounting_side = Both;
      part.part_type = SMD;
      part.end_of_pins = 0;
      part.p1.x = 0;
      part.p1.y = 0;
      part.p2.x = 0;
      part.p2.y = 0;
      while (*pbVar9 != 0) {
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 == 0) break;
        pbVar9 = pbVar9 + 1;
        *p = (char *)pbVar9;
      }
      ppcVar5 = local_1b8;
      *s = (char *)pbVar9;
      pbVar9 = (byte *)*p;
      while( true ) {
        if (*pbVar9 == 0) break;
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 != 0) break;
        *p = (char *)(pbVar9 + 1);
        pbVar9 = pbVar9 + 1;
      }
      *pbVar9 = 0;
      *p = *p + 1;
      part.name = fix_to_utf8(*s,arena,*ppcVar5);
      part._40_8_ = part._40_8_ & 0xffffffff;
      pbVar9 = (byte *)*p;
      while (*pbVar9 != 0) {
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 == 0) break;
        pbVar9 = pbVar9 + 1;
        *p = (char *)pbVar9;
      }
      *s = (char *)pbVar9;
      pbVar9 = (byte *)*p;
      while( true ) {
        if (*pbVar9 == 0) break;
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 != 0) break;
        *p = (char *)(pbVar9 + 1);
        pbVar9 = pbVar9 + 1;
      }
      *pbVar9 = 0;
      *p = *p + 1;
      pcVar8 = fix_to_utf8(*s,arena,*ppcVar5);
      iVar6 = strcmp(pcVar8,"(T)");
      part.mounting_side = (iVar6 == 0) + Bottom;
      part.end_of_pins = 0;
      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                (&(this->super_BRDFileBase).parts,&part);
      std::__cxx11::string::~string((string *)&part.mfgcode);
    }
    else {
      part.mfgcode._M_string_length = (ulong)part.mfgcode._M_string_length._4_4_ << 0x20;
      part.mfgcode.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_72a25;
      part.mfgcode.field_2._8_8_ = 0x3fe0000000000000;
      part.mounting_side = Both;
      part.part_type = SMD;
      part.end_of_pins = 0;
      part.p1.x = 0;
      part.mfgcode._M_dataplus._M_p =
           (pointer)(((long)(this->super_BRDFileBase).parts.
                            super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->super_BRDFileBase).parts.
                           super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x48 << 0x20);
      strtol(pcVar8,p,10);
      pbVar9 = (byte *)*p;
      while (*pbVar9 != 0) {
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 == 0) break;
        pbVar9 = pbVar9 + 1;
        *p = (char *)pbVar9;
      }
      *s = (char *)pbVar9;
      pbVar9 = (byte *)*p;
      while( true ) {
        pbVar10 = pbVar9 + 1;
        if ((*pbVar9 == 0) || (bVar1 = *pbVar10, bVar1 == 0)) break;
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 != 0) {
          iVar6 = isspace((uint)bVar1);
          if (iVar6 != 0) break;
        }
        *p = (char *)pbVar10;
        pbVar9 = pbVar10;
      }
      *pbVar9 = 0;
      *p = *p + 1;
      fix_to_utf8(*s,arena,*local_1b8);
      dVar3 = strtod(*p,p);
      dVar4 = strtod(*p,p);
      part.name = (char *)CONCAT44((int)(dVar4 * 1000.0),(int)(dVar3 * 1000.0));
      strtol(*p,p,10);
      pbVar9 = (byte *)*p;
      while (*pbVar9 != 0) {
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 == 0) break;
        pbVar9 = pbVar9 + 1;
        *p = (char *)pbVar9;
      }
      ppcVar5 = local_1b8;
      *s = (char *)pbVar9;
      pbVar9 = (byte *)*p;
      while( true ) {
        if (*pbVar9 == 0) break;
        iVar6 = isspace((uint)*pbVar9);
        if (iVar6 != 0) break;
        *p = (char *)(pbVar9 + 1);
        pbVar9 = pbVar9 + 1;
      }
      *pbVar9 = 0;
      *p = *p + 1;
      part.mfgcode.field_2._M_allocated_capacity = (size_type)fix_to_utf8(*s,arena,*ppcVar5);
      lVar7 = strtol(*p,p,10);
      if ((int)lVar7 < 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/ASCFile.cpp"
                   ,&local_1b9);
        std::operator+(&local_130,&local_70,":");
        std::__cxx11::to_string(&local_150,0x3c);
        std::operator+(&local_110,&local_130,&local_150);
        std::operator+(&local_f0,&local_110,": ");
        std::operator+(&local_d0,&local_f0,
                       "auto ASCFile::parse_pin(char *&, char *&, char *&, char *&, line_iterator_t &)::(anonymous class)::operator()() const"
                      );
        std::operator+(&local_b0,&local_d0,": Assertion `");
        std::operator+(&local_90,&local_b0,"value >= 0");
        std::operator+(&local_50,&local_90,"\' failed.");
        std::__cxx11::string::operator=
                  ((string *)&(this->super_BRDFileBase).error_msg,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_70);
        SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
      }
      part.mfgcode._M_dataplus._M_p._0_4_ = (int)lVar7;
      BVar2 = (this->super_BRDFileBase).parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1].mounting_side;
      if (BVar2 < (Top|Bottom)) {
        part.mfgcode._M_string_length = CONCAT44(part.mfgcode._M_string_length._4_4_,BVar2);
      }
      std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                (&(this->super_BRDFileBase).pins,(value_type *)&part);
      (this->super_BRDFileBase).parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].end_of_pins =
           (uint)(((long)(this->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_BRDFileBase).pins.
                        super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x38);
    }
  }
  return;
}

Assistant:

void ASCFile::parse_pin(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstpin) {
		line_it += 7; // Skip 7+1 unused lines before 1st part
		m_firstpin = false;
		return;
	}
	if (!strncmp(p, "Part", 4)) {
		p += 4; // Skip "Part" string
		BRDPart part;

		part.name      = READ_STR();
		part.part_type = BRDPartType::SMD;
		char *loc      = READ_STR();
		if (!strcmp(loc, "(T)"))
			part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
		else
			part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
		part.end_of_pins       = 0;
		parts.push_back(part);
	} else {
		BRDPin pin;

		pin.part = parts.size();
		/*int id =*/READ_INT(); // uint
		/*char *name =*/READ_STR2();
		double posx = READ_DOUBLE();
		pin.pos.x   = posx * 1000.0f;
		double posy = READ_DOUBLE();
		pin.pos.y   = posy * 1000.0f;
		/*int layer =*/READ_INT(); // uint
		pin.net   = READ_STR();
		pin.probe = READ_UINT();
		switch (parts.back().mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
		pins.push_back(pin);
		parts.back().end_of_pins = pins.size();
	}
}